

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lda_xc_ksdt.c
# Opt level: O0

void lda_xc_ksdt_init(xc_func_type *p)

{
  int iVar1;
  void *pvVar2;
  undefined8 *in_RDI;
  lda_xc_ksdt_params *params;
  
  pvVar2 = malloc(0x130);
  in_RDI[0x2f] = pvVar2;
  pvVar2 = (void *)in_RDI[0x2f];
  iVar1 = *(int *)*in_RDI;
  if (iVar1 == 0x103) {
    memcpy(pvVar2,&par_ksdt,0x130);
  }
  else if (iVar1 == 0x13e) {
    memcpy(pvVar2,&par_corrksdt,0x130);
  }
  else {
    if (iVar1 != 0x241) {
      fprintf(_stderr,"Internal error in lda_xc_ksdt\n");
      exit(1);
    }
    memcpy(pvVar2,&par_gdsmfb,0x130);
  }
  return;
}

Assistant:

static void
lda_xc_ksdt_init(xc_func_type *p)
{
  lda_xc_ksdt_params *params;

  assert(p!=NULL && p->params == NULL);
  p->params = libxc_malloc(sizeof(lda_xc_ksdt_params));
  params = (lda_xc_ksdt_params *)(p->params);

  switch(p->info->number){
  case XC_LDA_XC_KSDT:
    libxc_memcpy(params, &par_ksdt, sizeof(lda_xc_ksdt_params));
    break;
  case XC_LDA_XC_GDSMFB:
    libxc_memcpy(params, &par_gdsmfb, sizeof(lda_xc_ksdt_params));
    break;
  case XC_LDA_XC_CORRKSDT:
    libxc_memcpy(params, &par_corrksdt, sizeof(lda_xc_ksdt_params));
    break;
  default:
    fprintf(stderr, "Internal error in lda_xc_ksdt\n");
    exit(1);
  }
}